

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadso.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  code *pcVar4;
  char *pcVar5;
  char *__s1;
  
  if (argc == 3) {
    iVar1 = SDL_Init(0);
    if (iVar1 < 0) {
      main_cold_4();
      iVar1 = 2;
    }
    else {
      __s1 = argv[1];
      iVar2 = strcmp(__s1,"--hello");
      if (iVar2 == 0) {
        __s1 = argv[2];
      }
      pcVar5 = "puts";
      if (iVar2 != 0) {
        pcVar5 = argv[2];
      }
      lVar3 = SDL_LoadObject(__s1);
      if (lVar3 == 0) {
        main_cold_3();
        iVar1 = 3;
      }
      else {
        pcVar4 = (code *)SDL_LoadFunction(lVar3,pcVar5);
        if (pcVar4 == (code *)0x0) {
          main_cold_2();
          iVar1 = 4;
        }
        else {
          printf("Found %s in %s at %p\n",pcVar5,__s1,pcVar4);
          iVar1 = 0;
          if (iVar2 == 0) {
            puts("Calling function...");
            fflush(_stdout);
            (*pcVar4)("     HELLO, WORLD!\n");
            puts("...apparently, we survived.  :)");
            puts("Unloading library...");
            fflush(_stdout);
            iVar1 = 0;
          }
        }
        SDL_UnloadObject(lVar3);
      }
      SDL_Quit();
    }
  }
  else {
    main_cold_1();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	int retval = 0;
	int hello = 0;
	const char *libname = NULL;
	const char *symname = NULL;
	void *lib = NULL;
	fntype fn = NULL;

	if (argc != 3) {
		const char *app = argv[0];
		fprintf(stderr, "USAGE: %s <library> <functionname>\n", app);
		fprintf(stderr, "       %s --hello <lib with puts()>\n", app);
		return 1;
	}

	/* Initialize SDL */
	if ( SDL_Init(0) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return 2;
	}

	if (strcmp(argv[1], "--hello") == 0) {
		hello = 1;
		libname = argv[2];
		symname = "puts";
	} else {
		libname = argv[1];
		symname = argv[2];
	}

	lib = SDL_LoadObject(libname);
        if (lib == NULL) {
		fprintf(stderr, "SDL_LoadObject('%s') failed: %s\n",
		        libname, SDL_GetError());
		retval = 3;
	} else {
		fn = (fntype) SDL_LoadFunction(lib, symname);
		if (fn == NULL) {
			fprintf(stderr, "SDL_LoadFunction('%s') failed: %s\n",
			        symname, SDL_GetError());
			retval = 4;
		} else {
			printf("Found %s in %s at %p\n", symname, libname, fn);
			if (hello) {
				printf("Calling function...\n");
				fflush(stdout);
				fn("     HELLO, WORLD!\n");
				printf("...apparently, we survived.  :)\n");
				printf("Unloading library...\n");
				fflush(stdout);
			}
		}
		SDL_UnloadObject(lib);
	}
	SDL_Quit();
	return retval;
}